

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.cpp
# Opt level: O0

void __thiscall
glslang::HlslTokenStream::pushTokenStream(HlslTokenStream *this,TVector<glslang::HlslToken> *tokens)

{
  const_reference __src;
  value_type_conflict6 local_1c;
  vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_> *local_18;
  TVector<glslang::HlslToken> *tokens_local;
  HlslTokenStream *this_local;
  
  local_18 = &tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>
  ;
  tokens_local = (TVector<glslang::HlslToken> *)this;
  if (this->preTokenStackSize == 0) {
    std::vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>::push_back
              (&(this->currentTokenStack).
                super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>,
               &this->token);
    std::
    vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
    ::push_back(&(this->tokenStreamStack).
                 super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
                ,(value_type *)&local_18);
    __src = std::vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>::
            operator[](local_18,0);
    memcpy(&this->token,__src,0x28);
    local_1c = 0;
    std::vector<int,_glslang::pool_allocator<int>_>::push_back
              (&(this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>,&local_1c);
    return;
  }
  __assert_fail("preTokenStackSize == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslTokenStream.cpp"
                ,0x4e,"void glslang::HlslTokenStream::pushTokenStream(const TVector<HlslToken> *)");
}

Assistant:

void HlslTokenStream::pushTokenStream(const TVector<HlslToken>* tokens)
{
    // not yet setup to interrupt a stream that has been receded
    // and not yet reconsumed
    assert(preTokenStackSize == 0);

    // save current state
    currentTokenStack.push_back(token);

    // set up new token stream
    tokenStreamStack.push_back(tokens);

    // start position at first token:
    token = (*tokens)[0];
    tokenPosition.push_back(0);
}